

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O1

QAccessibleInterface * __thiscall QAccessibleTabBar::child(QAccessibleTabBar *this,int index)

{
  Data<QHashPrivate::Node<int,_unsigned_int>_> *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Node<int,_unsigned_int> *pNVar4;
  uint *puVar5;
  QAccessibleInterface *pQVar6;
  QTabBar *pQVar7;
  QObject *pQVar8;
  undefined8 uVar9;
  long lVar10;
  uint uVar11;
  long in_FS_OFFSET;
  int copy;
  uint local_34;
  int local_30;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->m_childInterfaces).d;
  local_30 = index;
  if ((this_00 == (Data<QHashPrivate::Node<int,_unsigned_int>_> *)0x0) ||
     (pNVar4 = QHashPrivate::Data<QHashPrivate::Node<int,_unsigned_int>_>::findNode<int>
                         (this_00,&local_30), pNVar4 == (Node<int,_unsigned_int> *)0x0)) {
    puVar5 = (uint *)0x0;
  }
  else {
    puVar5 = &pNVar4->value;
  }
  iVar3 = local_30;
  if (puVar5 == (uint *)0x0) {
    uVar11 = 0;
  }
  else {
    uVar11 = *puVar5;
  }
  if (uVar11 != 0) {
    pQVar6 = (QAccessibleInterface *)QAccessible::accessibleInterface(uVar11);
    goto LAB_0051f20f;
  }
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  pQVar7 = (QTabBar *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
  iVar2 = QTabBar::count(pQVar7);
  iVar1 = local_30;
  if (iVar3 < iVar2) {
    pQVar6 = (QAccessibleInterface *)operator_new(0x28);
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    pQVar8 = (QObject *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
    iVar3 = local_30;
    *(undefined ***)pQVar6 = &PTR__QAccessibleTabButton_00814a70;
    *(undefined ***)(pQVar6 + 8) = &PTR__QAccessibleTabButton_00814b40;
    if (pQVar8 == (QObject *)0x0) {
      uVar9 = 0;
    }
    else {
      uVar9 = QtSharedPointer::ExternalRefCountData::getAndRef(pQVar8);
    }
    *(undefined8 *)(pQVar6 + 0x10) = uVar9;
    *(QObject **)(pQVar6 + 0x18) = pQVar8;
    *(int *)(pQVar6 + 0x20) = iVar3;
    QAccessible::registerAccessibleInterface(pQVar6);
    local_34 = QAccessible::uniqueId(pQVar6);
    local_2c = local_30;
    QHash<int,unsigned_int>::emplace<unsigned_int_const&>
              ((QHash<int,unsigned_int> *)&this->m_childInterfaces,&local_2c,&local_34);
    goto LAB_0051f20f;
  }
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  pQVar7 = (QTabBar *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
  iVar2 = QTabBar::count(pQVar7);
  iVar3 = local_30;
  if (iVar1 < iVar2) {
LAB_0051f123:
    pQVar6 = (QAccessibleInterface *)0x0;
  }
  else {
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    pQVar7 = (QTabBar *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
    iVar2 = QTabBar::count(pQVar7);
    iVar1 = local_30;
    if (iVar3 == iVar2) {
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      lVar10 = QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
      pQVar8 = *(QObject **)(*(long *)(lVar10 + 8) + 0x290);
    }
    else {
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar7 = (QTabBar *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
      iVar3 = QTabBar::count(pQVar7);
      if (iVar1 - iVar3 != 1) goto LAB_0051f123;
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      lVar10 = QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
      pQVar8 = *(QObject **)(*(long *)(lVar10 + 8) + 0x288);
    }
    pQVar6 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar8);
  }
LAB_0051f20f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return pQVar6;
}

Assistant:

QAccessibleInterface* QAccessibleTabBar::child(int index) const
{
    if (QAccessible::Id id = m_childInterfaces.value(index))
        return QAccessible::accessibleInterface(id);

    // first the tabs, then 2 buttons
    if (index < tabBar()->count()) {
        QAccessibleTabButton *button = new QAccessibleTabButton(tabBar(), index);
        QAccessible::registerAccessibleInterface(button);
        m_childInterfaces.insert(index, QAccessible::uniqueId(button));
        return button;
    } else if (index >= tabBar()->count()) {
        // left button
        if (index - tabBar()->count() == 0) {
            return QAccessible::queryAccessibleInterface(tabBar()->d_func()->leftB);
        }
        // right button
        if (index - tabBar()->count() == 1) {
            return QAccessible::queryAccessibleInterface(tabBar()->d_func()->rightB);
        }
    }
    return nullptr;
}